

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool scanImports(Options *options,QSet<QString> *usedDependencies)

{
  QArrayDataPointer<char16_t> *pQVar1;
  pointer pQVar2;
  FILE *pFVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  UP __stream;
  qsizetype qVar7;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  bool bVar10;
  char cVar11;
  bool bVar12;
  char cVar13;
  iterator iVar14;
  iterator iVar15;
  char *pcVar16;
  size_t sVar17;
  long lVar18;
  iterator iVar19;
  iterator iVar20;
  QList<QtDependency> *this;
  undefined8 *puVar21;
  QtDependency *pQVar22;
  QString *import;
  QString *pQVar23;
  uint uVar24;
  long lVar25;
  pointer pQVar26;
  QChar QVar27;
  QString *prefix;
  QArrayDataPointer<char16_t> *pQVar28;
  QString *qrcFile;
  long in_FS_OFFSET;
  QAnyStringView QVar29;
  QLatin1String QVar30;
  QAnyStringView QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QJsonArray local_4e0 [8];
  QFileInfo qmldirFileInfo;
  QHash<QString,_QHashDummyValue> local_4d0;
  QArrayDataPointer<char16_t> local_4c8;
  QFileInfo pluginFileInfo;
  QArrayDataPointer<char16_t> local_4a8;
  QArrayDataPointer<char16_t> local_488;
  QArrayDataPointer<QtDependency> local_468;
  QArrayDataPointer<char16_t> local_448;
  QUrl url;
  QFileInfo info;
  QJsonObject object;
  QJsonArray jsonArray;
  QJsonDocument jsonDocument;
  UP qmlImportScannerCommand;
  QArrayDataPointer<char16_t> local_3f8;
  QArrayDataPointer<char16_t> local_3d8;
  QArrayDataPointer<QString> local_3b8;
  QArrayDataPointer<char16_t> local_398;
  QArrayDataPointer<char16_t> local_378;
  QSet<QString> *usedDependencies_local;
  QFileInfo fileInfo;
  undefined6 uStack_356;
  QArrayDataPointer<QVariant> local_340;
  QArrayDataPointer<QVariant> local_328;
  undefined1 local_308 [8];
  QtDependency *pQStack_300;
  QArrayDataPointer<char16_t> *local_2f8;
  char *local_2f0;
  QArrayDataPointer<char16_t> *local_2e8;
  char16_t local_2e0;
  QString *local_2d8;
  qsizetype local_2d0;
  char *local_2c8;
  QArrayDataPointer<QtDependency> local_2b8;
  QArrayDataPointer<char16_t> local_298;
  QArrayDataPointer<char16_t> local_278;
  char buffer [512];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  usedDependencies_local = usedDependencies;
  if (options->verbose == true) {
    fwrite("Scanning for QML imports.\n",0x1a,1,_stdout);
  }
  local_378.size = 0;
  local_378.d = (Data *)0x0;
  local_378.ptr = (char16_t *)0x0;
  if ((options->qmlImportScannerBinaryPath).d.size == 0) {
    local_308 = (undefined1  [8])&options->qtLibExecsDirectory;
    pQStack_300 = (QtDependency *)0x11;
    local_2f8 = (QArrayDataPointer<char16_t> *)0x138d34;
    QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_398,(QStringBuilder<QString_&,_QLatin1String> *)local_308);
    qVar6 = local_378.size;
    buffer._8_8_ = local_378.ptr;
    buffer._0_8_ = local_378.d;
    local_378.size = local_398.size;
    local_378.ptr = local_398.ptr;
    local_378.d = local_398.d;
    local_398.size = 0;
    local_398.d = (Data *)0x0;
    local_398.ptr = (char16_t *)0x0;
    qVar7 = local_378.size;
    local_378.size._0_1_ = (undefined1)qVar6;
    local_378.size._1_1_ = SUB81(qVar6,1);
    local_378.size._2_1_ = SUB81(qVar6,2);
    local_378.size._3_1_ = SUB81(qVar6,3);
    local_378.size._4_1_ = SUB81(qVar6,4);
    local_378.size._5_1_ = SUB81(qVar6,5);
    local_378.size._6_1_ = SUB81(qVar6,6);
    local_378.size._7_1_ = SUB81(qVar6,7);
    buffer[0x10] = (undefined1)local_378.size;
    buffer[0x11] = local_378.size._1_1_;
    buffer[0x12] = local_378.size._2_1_;
    buffer[0x13] = local_378.size._3_1_;
    buffer[0x14] = local_378.size._4_1_;
    buffer[0x15] = local_378.size._5_1_;
    buffer[0x16] = local_378.size._6_1_;
    buffer[0x17] = local_378.size._7_1_;
    local_378.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_398);
  }
  else {
    QString::operator=((QString *)&local_378,(QString *)&options->qmlImportScannerBinaryPath);
  }
  local_3b8.size = 0;
  local_3b8.d = (Data *)0x0;
  local_3b8.ptr = (QString *)0x0;
  local_3d8.size = -0x5555555555555556;
  local_3d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_3d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  buffer._0_8_ = &options->qtInstallDirectory;
  buffer._16_8_ = &options->qtQmlDirectory;
  buffer[8] = '/';
  buffer[9] = '\0';
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&>::convertTo<QString>
            ((QString *)&local_3d8,
             (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&> *)buffer);
  cVar11 = QFile::exists((QString *)&local_3d8);
  if (cVar11 != '\0') {
    shellQuote((QString *)buffer,(QString *)&local_3d8);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_3b8,(QString *)buffer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
  }
  pQVar1 = &((options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>.
             _M_impl.super__Vector_impl_data._M_finish)->d;
  for (pQVar28 = &((options->extraPrefixDirs).super__Vector_base<QString,_std::allocator<QString>_>.
                   _M_impl.super__Vector_impl_data._M_start)->d; pQVar28 != pQVar1;
      pQVar28 = pQVar28 + 1) {
    pQStack_300 = (QtDependency *)0x4;
    local_2f8 = (QArrayDataPointer<char16_t> *)0x138d46;
    local_308 = (undefined1  [8])pQVar28;
    QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)buffer,(QStringBuilder<const_QString_&,_QLatin1String> *)local_308);
    cVar11 = QFile::exists((QString *)buffer);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
    if (cVar11 != '\0') {
      local_3f8.ptr = (char16_t *)0x4;
      local_3f8.size = 0x138d46;
      local_3f8.d = (Data *)pQVar28;
      QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
                ((QString *)local_308,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_3f8);
      shellQuote((QString *)buffer,(QString *)local_308);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_3b8,(QString *)buffer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_308);
    }
  }
  pQVar23 = (options->qmlImportPaths).d.ptr;
  for (lVar25 = (options->qmlImportPaths).d.size * 0x18; lVar25 != 0; lVar25 = lVar25 + -0x18) {
    cVar11 = QFile::exists((QString *)pQVar23);
    pFVar3 = _stderr;
    if (cVar11 == '\0') {
      QString::toLocal8Bit((QByteArray *)buffer,pQVar23);
      puVar21 = (undefined8 *)buffer._8_8_;
      if (buffer._8_8_ == 0) {
        puVar21 = &QByteArray::_empty;
      }
      fprintf(pFVar3,"Warning: QML import path %s does not exist.\n",puVar21);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
    }
    else {
      shellQuote((QString *)buffer,pQVar23);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_3b8,(QString *)buffer);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
    }
    pQVar23 = pQVar23 + 1;
  }
  iVar14 = QList<QString>::begin((QList<QString> *)&local_3b8);
  iVar15 = QList<QString>::end((QList<QString> *)&local_3b8);
  do {
    if (iVar14.i == iVar15.i) {
      fwrite("Warning: no \'qml\' directory found under Qt install directory or import paths. Skipping QML dependency scanning.\n"
             ,0x70,1,_stderr);
      goto LAB_001183a0;
    }
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    QDir::QDir((QDir *)local_308,(QString *)buffer);
    cVar11 = QDir::exists((QString *)local_308);
    QDir::~QDir((QDir *)local_308);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
    iVar14.i = iVar14.i + 1;
  } while (cVar11 == '\0');
  cVar11 = QFile::exists((QString *)&local_378);
  pFVar3 = _stderr;
  if (cVar11 == '\0') {
    QString::toLocal8Bit((QByteArray *)buffer,(QString *)&local_378);
    puVar21 = (undefined8 *)buffer._8_8_;
    if (buffer._8_8_ == 0) {
      puVar21 = &QByteArray::_empty;
    }
    fprintf(pFVar3,"%s: qmlimportscanner not found at %s\n","Error",puVar21);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
LAB_001183a0:
    bVar12 = true;
  }
  else {
    pQVar2 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pQVar26 = (options->rootPaths).super__Vector_base<QString,_std::allocator<QString>_>.
                   _M_impl.super__Vector_impl_data._M_start; pQVar26 != pQVar2;
        pQVar26 = pQVar26 + 1) {
      local_308 = (undefined1  [8])(pQVar26->d).d;
      pQStack_300 = (QtDependency *)(pQVar26->d).ptr;
      local_2f8 = (QArrayDataPointer<char16_t> *)(pQVar26->d).size;
      if (local_308 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(((QString *)local_308)->d).d)->_q_value).super___atomic_base<int>.
        _M_i = (((QBasicAtomicInt *)&(((QString *)local_308)->d).d)->_q_value).
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QFileInfo::QFileInfo((QFileInfo *)&local_3f8,(QString *)local_308);
      QFileInfo::absoluteFilePath();
      pQVar28 = local_2f8;
      pQVar22 = pQStack_300;
      auVar8 = local_308;
      local_308[0] = buffer[0];
      local_308[1] = buffer[1];
      local_308[2] = buffer[2];
      local_308[3] = buffer[3];
      local_308[4] = buffer[4];
      local_308[5] = buffer[5];
      local_308[6] = buffer[6];
      local_308[7] = buffer[7];
      pQStack_300 = (QtDependency *)buffer._8_8_;
      buffer._0_8_ = auVar8;
      buffer._8_8_ = pQVar22;
      local_2f8 = (QArrayDataPointer<char16_t> *)buffer._16_8_;
      buffer._16_8_ = pQVar28;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
      QFileInfo::~QFileInfo((QFileInfo *)&local_3f8);
      QVar27.ucs = (char16_t)(QArrayDataPointer<char16_t> *)local_308;
      cVar11 = QString::endsWith(QVar27,0x2f);
      if (cVar11 == '\0') {
        QString::append(QVar27);
      }
      if (local_2f8 != (QArrayDataPointer<char16_t> *)0x0) {
        shellQuote((QString *)buffer,(QString *)local_308);
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_3b8,(QString *)buffer);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)buffer);
      }
      shellQuote((QString *)&local_58,(QString *)local_308);
      buffer._16_8_ = local_58.size | 0x8000000000000000;
      buffer[0] = '\x01';
      buffer._8_8_ = local_58.ptr;
      local_278.ptr = (char16_t *)0x0;
      QVar29.m_size = (size_t)" -rootPath %1";
      QVar29.field_0.m_data_utf8 = (char *)&local_3f8;
      local_278.d = (Data *)buffer;
      QtPrivate::argToQString(QVar29,0x400000000000000d,(ArgBase **)0x1);
      QString::append((QString *)&local_378);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_308);
    }
    if ((options->qrcFiles).d.size != 0) {
      QVar30.m_data = (char *)0xa;
      QVar30.m_size = (qsizetype)&local_378;
      QString::append(QVar30);
      iVar14 = QList<QString>::begin(&options->qrcFiles);
      iVar15 = QList<QString>::end(&options->qrcFiles);
      for (; iVar14.i != iVar15.i; iVar14.i = iVar14.i + 1) {
        shellQuote((QString *)local_308,iVar14.i);
        buffer._24_8_ = local_2f8;
        buffer._16_8_ = pQStack_300;
        auVar8 = local_308;
        buffer[0] = ' ';
        buffer[1] = '\0';
        local_308 = (undefined1  [8])0x0;
        auVar9 = local_308;
        pQStack_300 = (QtDependency *)0x0;
        local_308[0] = auVar8[0];
        local_308[1] = auVar8[1];
        local_308[2] = auVar8[2];
        local_308[3] = auVar8[3];
        local_308[4] = auVar8[4];
        local_308[5] = auVar8[5];
        local_308[6] = auVar8[6];
        local_308[7] = auVar8[7];
        buffer[8] = local_308[0];
        buffer[9] = local_308[1];
        buffer[10] = local_308[2];
        buffer[0xb] = local_308[3];
        buffer[0xc] = local_308[4];
        buffer[0xd] = local_308[5];
        buffer[0xe] = local_308[6];
        buffer[0xf] = local_308[7];
        local_2f8 = (QArrayDataPointer<char16_t> *)0x0;
        local_308 = auVar9;
        operator+=((QString *)&local_378,(QStringBuilder<char16_t,_QString> *)buffer);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(buffer + 8))
        ;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_308);
      }
    }
    QListSpecialMethods<QString>::join
              ((QString *)&local_3f8,(QListSpecialMethods<QString> *)&local_3b8,(QChar)0x20);
    buffer._16_8_ = local_3f8.size | 0x8000000000000000;
    buffer[0] = '\x01';
    buffer._8_8_ = local_3f8.ptr;
    local_58.ptr = (char16_t *)0x0;
    QVar31.m_size = (size_t)" -importPath %1";
    QVar31.field_0.m_data = local_308;
    local_58.d = (Data *)buffer;
    QtPrivate::argToQString(QVar31,0x400000000000000f,(ArgBase **)0x1);
    QString::append((QString *)&local_378);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_308);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3f8);
    pFVar3 = _stdout;
    if (options->verbose == true) {
      QString::toLocal8Bit((QByteArray *)buffer,(QString *)&local_378);
      puVar21 = (undefined8 *)buffer._8_8_;
      if (buffer._8_8_ == 0) {
        puVar21 = &QByteArray::_empty;
      }
      fprintf(pFVar3,"Running qmlimportscanner with the following command: %s\n",puVar21);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
    }
    qmlImportScannerCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl
         = (__uniq_ptr_data<_IO_FILE,_Closer,_true,_true>)
           (__uniq_ptr_impl<_IO_FILE,_Closer>)0xaaaaaaaaaaaaaaaa;
    openProcess((QString *)&qmlImportScannerCommand);
    __stream = qmlImportScannerCommand;
    if ((__uniq_ptr_impl<_IO_FILE,_Closer>)
        qmlImportScannerCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>.
        _M_head_impl == (__uniq_ptr_impl<_IO_FILE,_Closer>)0x0) {
      fwrite("Couldn\'t run qmlimportscanner.\n",0x1f,1,_stderr);
      bVar12 = false;
    }
    else {
      local_3f8.d = (Data *)0x0;
      local_3f8.ptr = (char16_t *)0x0;
      local_3f8.size = 0;
      memset(buffer,0xaa,0x200);
      while (pcVar16 = fgets(buffer,0x200,
                             (FILE *)__stream._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
                                     super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.
                                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl),
            pcVar16 != (char *)0x0) {
        sVar17 = strlen(buffer);
        QByteArray::QByteArray((QByteArray *)local_308,buffer,sVar17);
        QByteArray::append((QByteArray *)&local_3f8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_308);
      }
      _jsonDocument = 0xaaaaaaaaaaaaaaaa;
      QJsonDocument::fromJson((QByteArray *)&jsonDocument,(QJsonParseError *)&local_3f8);
      cVar11 = QJsonDocument::isNull();
      if (cVar11 == '\0') {
        _jsonArray = 0xaaaaaaaaaaaaaaaa;
        QJsonDocument::array();
        lVar25 = 0;
        while( true ) {
          lVar18 = QJsonArray::size();
          if (lVar18 <= lVar25) break;
          local_58.size = 0xaaaaaaaaaaaaaaaa;
          local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          QJsonArray::at((longlong)&local_58);
          bVar12 = QJsonValue::isObject((QJsonValue *)&local_58);
          if (!bVar12) {
            fwrite("Invalid format of qmlimportscanner output.\n",0x2b,1,_stderr);
            QJsonValue::~QJsonValue((QJsonValue *)&local_58);
            bVar12 = false;
            goto LAB_001182aa;
          }
          _object = 0xaaaaaaaaaaaaaaaa;
          QJsonValue::toObject();
          local_278.size = -0x5555555555555556;
          local_278.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_278.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          QVar32.m_data = (char *)&object;
          QVar32.m_size = (qsizetype)local_308;
          QJsonObject::value(QVar32);
          QJsonValue::toString();
          QJsonValue::~QJsonValue((QJsonValue *)local_308);
          pFVar3 = _stderr;
          if (local_278.size == 0) {
            QVar35.m_data = (char *)&object;
            QVar35.m_size = (qsizetype)&local_2b8;
            QJsonObject::value(QVar35);
            QJsonValue::toString();
            QString::toLocal8Bit((QByteArray *)local_308,(QString *)&local_298);
            pQVar22 = pQStack_300;
            if (pQStack_300 == (QtDependency *)0x0) {
              pQVar22 = (QtDependency *)&QByteArray::_empty;
            }
            fprintf(pFVar3,
                    "Warning: QML import could not be resolved in any of the import paths: %s\n",
                    pQVar22);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_308);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
            QJsonValue::~QJsonValue((QJsonValue *)&local_2b8);
LAB_001181df:
            uVar24 = 0;
          }
          else {
            QVar33.m_data = (char *)&object;
            QVar33.m_size = (qsizetype)&local_298;
            QJsonObject::value(QVar33);
            QJsonValue::toString();
            local_2b8.d = (Data *)0x6;
            local_2b8.ptr = (QtDependency *)0x138f39;
            bVar12 = operator==((QString *)local_308,(QLatin1StringView *)&local_2b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_308);
            QJsonValue::~QJsonValue((QJsonValue *)&local_298);
            pFVar3 = _stdout;
            if (!bVar12) goto LAB_001181df;
            if (options->verbose == true) {
              QString::toLocal8Bit((QByteArray *)local_308,(QString *)&local_278);
              pQVar22 = pQStack_300;
              if (pQStack_300 == (QtDependency *)0x0) {
                pQVar22 = (QtDependency *)&QByteArray::_empty;
              }
              fprintf(pFVar3,"  -- Adding \'%s\' as QML dependency\n",pQVar22);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_308);
            }
            _info = 0xaaaaaaaaaaaaaaaa;
            QFileInfo::QFileInfo(&info,(QString *)&local_278);
            cVar11 = QFileInfo::exists();
            if (cVar11 == '\0') {
              uVar24 = 0x10;
              if (options->verbose == true) {
                fwrite("    -- Skipping because path does not exist.\n",0x2d,1,_stdout);
                uVar24 = 0x10;
              }
            }
            else {
              local_298.size = -0x5555555555555556;
              local_298.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_298.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              QFileInfo::absolutePath();
              cVar11 = QString::endsWith((QChar)(char16_t)&local_298,0x2f);
              if (cVar11 == '\0') {
                QString::append((QChar)(char16_t)&local_298);
              }
              _url = 0xaaaaaaaaaaaaaaaa;
              QVar34.m_data = (char *)&object;
              QVar34.m_size = (qsizetype)&local_2b8;
              QJsonObject::value(QVar34);
              QJsonValue::toString();
              QUrl::QUrl(&url,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                               *)local_308,0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_308);
              QJsonValue::~QJsonValue((QJsonValue *)&local_2b8);
              local_2b8.size = -0x5555555555555556;
              local_2b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_2b8.ptr = (QtDependency *)0xaaaaaaaaaaaaaaaa;
              Qt::Literals::StringLiterals::operator____s((QString *)&local_448,L"/",1);
              QUrl::toString(&local_468,&url,0);
              local_2f0 = (char *)QString::replace((QChar)(char16_t)&local_468,(QChar)0x2e,0x2f);
              local_2f8 = (QArrayDataPointer<char16_t> *)local_448.size;
              pQStack_300 = (QtDependency *)local_448.ptr;
              local_308 = (undefined1  [8])local_448.d;
              local_448.d = (Data *)0x0;
              local_448.ptr = (char16_t *)0x0;
              local_448.size = 0;
              QStringBuilder<QString,_QString_&>::convertTo<QString>
                        ((QString *)&local_2b8,(QStringBuilder<QString,_QString_&> *)local_308);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_308);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_468);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_448);
              QFileInfo::absolutePath();
              bVar12 = checkCanImportFromRootPaths
                                 (options,(QString *)local_308,(QString *)&local_2b8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_308);
              if (bVar12) {
                uVar24 = 0x10;
                if (options->verbose == true) {
                  fwrite("    -- Skipping because path is in QML root path.\n",0x32,1,_stdout);
                  uVar24 = 0x10;
                }
              }
              else {
                local_448.size = 0;
                local_448.d = (Data *)0x0;
                local_448.ptr = (char16_t *)0x0;
                pQVar23 = local_3b8.ptr;
                for (lVar18 = local_3b8.size * 0x18; lVar18 != 0; lVar18 = lVar18 + -0x18) {
                  local_2f8 = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
                  local_308 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
                  pQStack_300 = (QtDependency *)0xaaaaaaaaaaaaaaaa;
                  QDir::cleanPath((QString *)local_308);
                  local_488.ptr = (char16_t *)&local_2b8;
                  local_488.d = (Data *)local_308;
                  QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                            ((QString *)&local_468,
                             (QStringBuilder<QString_&,_const_QString_&> *)&local_488);
                  cVar11 = QFile::exists((QString *)&local_468);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_468);
                  if (cVar11 != '\0') {
                    QString::operator=((QString *)&local_448,(QString *)pQVar23);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_308);
                    break;
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_308);
                  pQVar23 = pQVar23 + 1;
                }
                pFVar3 = _stderr;
                if ((char *)local_448.size == (char *)0x0) {
                  QFileInfo::absoluteFilePath();
                  QString::toLocal8Bit((QByteArray *)local_308,(QString *)&local_468);
                  pQVar22 = pQStack_300;
                  if (pQStack_300 == (QtDependency *)0x0) {
                    pQVar22 = (QtDependency *)&QByteArray::_empty;
                  }
                  fprintf(pFVar3,"Import found outside of import paths: %s.\n",pQVar22);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_308);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_468);
                  uVar24 = 1;
                }
                else {
                  QDir::QDir((QDir *)&local_4a8,(QString *)&local_448);
                  QDir::absolutePath();
                  local_2f8 = (QArrayDataPointer<char16_t> *)local_488.size;
                  pQStack_300 = (QtDependency *)local_488.ptr;
                  local_308 = (undefined1  [8])local_488.d;
                  local_488.d = (Data *)0x0;
                  local_488.ptr = (char16_t *)0x0;
                  local_488.size = 0;
                  local_2f0 = (char *)CONCAT62(local_2f0._2_6_,0x2f);
                  QStringBuilder<QString,_char16_t>::convertTo<QString>
                            ((QString *)&local_468,(QStringBuilder<QString,_char16_t> *)local_308);
                  qVar6 = local_448.size;
                  pcVar5 = local_448.ptr;
                  pDVar4 = local_448.d;
                  local_448.d = (Data *)local_468.d;
                  local_448.ptr = (char16_t *)local_468.ptr;
                  local_468.d = (Data *)pDVar4;
                  local_468.ptr = (QtDependency *)pcVar5;
                  local_448.size = local_468.size;
                  local_468.size = qVar6;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_468);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_308);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_488);
                  QDir::~QDir((QDir *)&local_4a8);
                  local_468.d = (Data *)0x0;
                  local_468.ptr = (QtDependency *)0x0;
                  local_468.size = 0;
                  local_488.d = (Data *)&usedDependencies_local;
                  local_488.size = (qsizetype)&local_448;
                  local_4a8.size = -0x5555555555555556;
                  local_4a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
                  local_4a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                  QVar36.m_data = (char *)&object;
                  QVar36.m_size = (qsizetype)local_308;
                  local_488.ptr = (char16_t *)&local_468;
                  QJsonObject::value(QVar36);
                  QJsonValue::toString();
                  QJsonValue::~QJsonValue((QJsonValue *)local_308);
                  QVar37.m_data = (char *)&object;
                  QVar37.m_size = (qsizetype)local_308;
                  QJsonObject::value(QVar37);
                  cVar11 = QJsonValue::toBool(SUB81((
                                                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                                                  *)local_308,0));
                  QJsonValue::~QJsonValue((QJsonValue *)local_308);
                  _pluginFileInfo = 0xaaaaaaaaaaaaaaaa;
                  local_308 = (undefined1  [8])&local_278;
                  pQStack_300 = (QtDependency *)CONCAT62(pQStack_300._2_6_,0x2f);
                  local_2f8 = (QArrayDataPointer<char16_t> *)0x3;
                  local_2f0 = "lib";
                  local_2e0 = L'_';
                  local_2d0 = 3;
                  local_2c8 = ".so";
                  local_2e8 = &local_4a8;
                  local_2d8 = &options->currentArchitecture;
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                  ::convertTo<QString>
                            ((QString *)&local_4c8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
                              *)local_308);
                  QFileInfo::QFileInfo(&pluginFileInfo,(QString *)&local_4c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4c8);
                  local_4c8.size = -0x5555555555555556;
                  local_4c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
                  local_4c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                  QFileInfo::absoluteFilePath();
                  local_4d0.d = (Data *)0x0;
                  cVar13 = QFileInfo::exists();
                  if (((cVar13 == '\0') ||
                      (bVar12 = checkArchitecture(options,(QString *)&local_4c8), !bVar12)) ||
                     (bVar12 = readDependenciesFromElf
                                         (options,(QString *)&local_4c8,usedDependencies_local,
                                          (QSet<QString> *)&local_4d0), !bVar12)) {
                    if (cVar11 != '\0') goto LAB_00117df2;
                    uVar24 = 0x10;
                    if (options->verbose == true) {
                      fwrite("    -- Skipping because the required plugin is missing.\n",0x38,1,
                             _stdout);
                      uVar24 = 0x10;
                    }
                  }
                  else {
                    scanImports::anon_class_24_3_0a0102aa::operator()
                              ((anon_class_24_3_0a0102aa *)&local_488,(QString *)&local_4c8);
LAB_00117df2:
                    _qmldirFileInfo = 0xaaaaaaaaaaaaaaaa;
                    local_308 = (undefined1  [8])&local_278;
                    pQStack_300 = (QtDependency *)CONCAT62(pQStack_300._2_6_,0x2f);
                    local_2f8 = (QArrayDataPointer<char16_t> *)0x6;
                    local_2f0 = "qmldir";
                    QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>::
                    convertTo<QString>((QString *)&local_328,
                                       (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>
                                        *)local_308);
                    QFileInfo::QFileInfo(&qmldirFileInfo,(QString *)&local_328);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&local_328);
                    cVar11 = QFileInfo::exists();
                    if (cVar11 != '\0') {
                      QFileInfo::absoluteFilePath();
                      scanImports::anon_class_24_3_0a0102aa::operator()
                                ((anon_class_24_3_0a0102aa *)&local_488,(QString *)local_308);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)local_308);
                    }
                    local_2f8 = (QArrayDataPointer<char16_t> *)0xaaaaaaaaaaaaaaaa;
                    local_308 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
                    pQStack_300 = (QtDependency *)0xaaaaaaaaaaaaaaaa;
                    QVar38.m_data = (char *)&object;
                    QVar38.m_size = (qsizetype)&local_328;
                    QJsonObject::value(QVar38);
                    QJsonValue::toString();
                    QJsonValue::~QJsonValue((QJsonValue *)&local_328);
                    QVar39.m_data = (char *)0x2;
                    QVar39.m_size = (qsizetype)local_308;
                    cVar11 = QString::startsWith(QVar39,0x139048);
                    if (cVar11 == '\0') {
                      local_328.size = -0x5555555555555556;
                      local_328.d = (Data *)0xaaaaaaaaaaaaaaaa;
                      local_328.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
                      QVar40.m_data = (char *)&object;
                      QVar40.m_size = (qsizetype)&local_340;
                      QJsonObject::value(QVar40);
                      QJsonValue::toArray();
                      QJsonArray::toVariantList();
                      QJsonArray::~QJsonArray((QJsonArray *)&fileInfo);
                      QJsonValue::~QJsonValue((QJsonValue *)&local_340);
                      QVar41.m_data = (char *)&object;
                      QVar41.m_size = (qsizetype)&fileInfo;
                      QJsonObject::value(QVar41);
                      QJsonValue::toArray();
                      QJsonArray::toVariantList();
                      QList<QVariant>::append
                                ((QList<QVariant> *)&local_328,(QList<QVariant> *)&local_340);
                      QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_340);
                      QJsonArray::~QJsonArray(local_4e0);
                      QJsonValue::~QJsonValue((QJsonValue *)&fileInfo);
                      iVar19 = QList<QVariant>::begin((QList<QVariant> *)&local_328);
                      iVar20 = QList<QVariant>::end((QList<QVariant> *)&local_328);
                      bVar12 = false;
                      do {
                        if (iVar19.i == iVar20.i) break;
                        _fileInfo = L'ꪪ';
                        uStack_356 = 0xaaaaaaaaaaaa;
                        QVariant::toString();
                        QFileInfo::QFileInfo(&fileInfo,(QString *)&local_340);
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)&local_340);
                        cVar11 = QFileInfo::exists();
                        bVar10 = true;
                        if (cVar11 != '\0') {
                          QFileInfo::absoluteFilePath();
                          scanImports::anon_class_24_3_0a0102aa::operator()
                                    ((anon_class_24_3_0a0102aa *)&local_488,(QString *)&local_340);
                          QArrayDataPointer<char16_t>::~QArrayDataPointer
                                    ((QArrayDataPointer<char16_t> *)&local_340);
                          bVar10 = bVar12;
                        }
                        bVar12 = bVar10;
                        QFileInfo::~QFileInfo(&fileInfo);
                        iVar19.i = iVar19.i + 1;
                      } while (cVar11 != '\0');
                      uVar24 = 0;
                      if ((bVar12) && (uVar24 = 0x10, options->verbose == true)) {
                        fwrite("    -- Skipping because the required qml files are missing.\n",0x3c,
                               1,_stdout);
                        uVar24 = 0x10;
                      }
                      QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_328);
                      if (!bVar12) goto LAB_0011812f;
                    }
                    else {
LAB_0011812f:
                      this = QHash<QString,_QList<QtDependency>_>::operator[]
                                       (&options->qtDependencies,&options->currentArchitecture);
                      QList<QtDependency>::append(this,(QList<QtDependency> *)&local_468);
                      uVar24 = 0;
                    }
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_308);
                    QFileInfo::~QFileInfo(&qmldirFileInfo);
                  }
                  QHash<QString,_QHashDummyValue>::~QHash(&local_4d0);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4c8);
                  QFileInfo::~QFileInfo(&pluginFileInfo);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4a8);
                  QArrayDataPointer<QtDependency>::~QArrayDataPointer(&local_468);
                }
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_448);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2b8);
              QUrl::~QUrl(&url);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
            }
            QFileInfo::~QFileInfo(&info);
            if (uVar24 == 0) goto LAB_001181df;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278);
          QJsonObject::~QJsonObject(&object);
          QJsonValue::~QJsonValue((QJsonValue *)&local_58);
          if ((uVar24 & 0xf) != 0) goto LAB_001182a4;
          lVar25 = lVar25 + 1;
        }
        uVar24 = 0xe;
LAB_001182a4:
        bVar12 = uVar24 == 0xe;
LAB_001182aa:
        QJsonArray::~QJsonArray(&jsonArray);
      }
      else {
        fwrite("Invalid json output from qmlimportscanner.\n",0x2b,1,_stderr);
        bVar12 = false;
      }
      QJsonDocument::~QJsonDocument(&jsonDocument);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_3f8);
    }
    std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr(&qmlImportScannerCommand);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3d8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_3b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_378);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool scanImports(Options *options, QSet<QString> *usedDependencies)
{
    if (options->verbose)
        fprintf(stdout, "Scanning for QML imports.\n");

    QString qmlImportScanner;
    if (!options->qmlImportScannerBinaryPath.isEmpty()) {
        qmlImportScanner = options->qmlImportScannerBinaryPath;
    } else {
        qmlImportScanner = execSuffixAppended(options->qtLibExecsDirectory +
                                              "/qmlimportscanner"_L1);
    }

    QStringList importPaths;

    // In Conan's case, qtInstallDirectory will point only to qtbase installed files, which
    // lacks a qml directory. We don't want to pass it as an import path if it doesn't exist
    // because it will cause qmlimportscanner to fail.
    // This also covers the case when only qtbase is installed in a regular Qt build.
    const QString mainImportPath = options->qtInstallDirectory + u'/' + options->qtQmlDirectory;
    if (QFile::exists(mainImportPath))
        importPaths += shellQuote(mainImportPath);

    // These are usually provided by CMake in the deployment json file from paths specified
    // in CMAKE_FIND_ROOT_PATH. They might not have qml modules.
    for (const QString &prefix : options->extraPrefixDirs)
        if (QFile::exists(prefix + "/qml"_L1))
            importPaths += shellQuote(prefix + "/qml"_L1);

    // These are provided by both CMake and qmake.
    for (const QString &qmlImportPath : std::as_const(options->qmlImportPaths)) {
        if (QFile::exists(qmlImportPath)) {
            importPaths += shellQuote(qmlImportPath);
        } else {
            fprintf(stderr, "Warning: QML import path %s does not exist.\n",
                    qPrintable(qmlImportPath));
        }
    }

    bool qmlImportExists = false;

    for (const QString &import : importPaths) {
        if (QDir().exists(import)) {
            qmlImportExists = true;
            break;
        }
    }

    // Check importPaths without rootPath, since we need at least one qml plugins
    // folder to run a QML file
    if (!qmlImportExists) {
        fprintf(stderr, "Warning: no 'qml' directory found under Qt install directory "
                "or import paths. Skipping QML dependency scanning.\n");
        return true;
    }

    if (!QFile::exists(qmlImportScanner)) {
        fprintf(stderr, "%s: qmlimportscanner not found at %s\n",
                qmlImportExists ? "Error"_L1.data() : "Warning"_L1.data(),
                qPrintable(qmlImportScanner));
        return true;
    }

    for (auto rootPath : options->rootPaths) {
        rootPath = QFileInfo(rootPath).absoluteFilePath();

        if (!rootPath.endsWith(u'/'))
            rootPath += u'/';

        // After checking for qml folder imports we can add rootPath
        if (!rootPath.isEmpty())
            importPaths += shellQuote(rootPath);

        qmlImportScanner += " -rootPath %1"_L1.arg(shellQuote(rootPath));
    }

    if (!options->qrcFiles.isEmpty()) {
        qmlImportScanner += " -qrcFiles"_L1;
        for (const QString &qrcFile : options->qrcFiles)
            qmlImportScanner += u' ' + shellQuote(qrcFile);
    }

    qmlImportScanner += " -importPath %1"_L1.arg(importPaths.join(u' '));

    if (options->verbose) {
        fprintf(stdout, "Running qmlimportscanner with the following command: %s\n",
            qmlImportScanner.toLocal8Bit().constData());
    }

    auto qmlImportScannerCommand = openProcess(qmlImportScanner);
    if (qmlImportScannerCommand == 0) {
        fprintf(stderr, "Couldn't run qmlimportscanner.\n");
        return false;
    }

    QByteArray output;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), qmlImportScannerCommand.get()) != nullptr)
        output += QByteArray(buffer, qstrlen(buffer));

    QJsonDocument jsonDocument = QJsonDocument::fromJson(output);
    if (jsonDocument.isNull()) {
        fprintf(stderr, "Invalid json output from qmlimportscanner.\n");
        return false;
    }

    QJsonArray jsonArray = jsonDocument.array();
    for (int i=0; i<jsonArray.count(); ++i) {
        QJsonValue value = jsonArray.at(i);
        if (!value.isObject()) {
            fprintf(stderr, "Invalid format of qmlimportscanner output.\n");
            return false;
        }

        QJsonObject object = value.toObject();
        QString path = object.value("path"_L1).toString();
        if (path.isEmpty()) {
            fprintf(stderr, "Warning: QML import could not be resolved in any of the import paths: %s\n",
                    qPrintable(object.value("name"_L1).toString()));
        } else if (object.value("type"_L1).toString() == "module"_L1) {
            if (options->verbose)
                fprintf(stdout, "  -- Adding '%s' as QML dependency\n", qPrintable(path));

            QFileInfo info(path);

            // The qmlimportscanner sometimes outputs paths that do not exist.
            if (!info.exists()) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path does not exist.\n");
                continue;
            }

            QString absolutePath = info.absolutePath();
            if (!absolutePath.endsWith(u'/'))
                absolutePath += u'/';

            const QUrl url(object.value("name"_L1).toString());

            const QString moduleUrlPath = u"/"_s + url.toString().replace(u'.', u'/');
            if (checkCanImportFromRootPaths(options, info.absolutePath(), moduleUrlPath)) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path is in QML root path.\n");
                continue;
            }

            QString importPathOfThisImport;
            for (const QString &importPath : std::as_const(importPaths)) {
                QString cleanImportPath = QDir::cleanPath(importPath);
                if (QFile::exists(cleanImportPath + moduleUrlPath)) {
                    importPathOfThisImport = importPath;
                    break;
                }
            }

            if (importPathOfThisImport.isEmpty()) {
                fprintf(stderr, "Import found outside of import paths: %s.\n", qPrintable(info.absoluteFilePath()));
                return false;
            }

            importPathOfThisImport = QDir(importPathOfThisImport).absolutePath() + u'/';
            QList<QtDependency> qmlImportsDependencies;
            auto collectQmlDependency = [&usedDependencies, &qmlImportsDependencies,
                                         &importPathOfThisImport](const QString &filePath) {
                if (!usedDependencies->contains(filePath)) {
                    usedDependencies->insert(filePath);
                    qmlImportsDependencies += QtDependency(
                            "qml/"_L1 + filePath.mid(importPathOfThisImport.size()),
                            filePath);
                }
            };

            QString plugin = object.value("plugin"_L1).toString();
            bool pluginIsOptional = object.value("pluginIsOptional"_L1).toBool();
            QFileInfo pluginFileInfo = QFileInfo(
                    path + u'/' + "lib"_L1 + plugin + u'_'
                    + options->currentArchitecture + ".so"_L1);
            QString pluginFilePath = pluginFileInfo.absoluteFilePath();
            QSet<QString> remainingDependencies;
            if (pluginFileInfo.exists() && checkArchitecture(*options, pluginFilePath)
                && readDependenciesFromElf(options, pluginFilePath, usedDependencies,
                                           &remainingDependencies)) {
                collectQmlDependency(pluginFilePath);
            } else if (!pluginIsOptional) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because the required plugin is missing.\n");
                continue;
            }

            QFileInfo qmldirFileInfo = QFileInfo(path + u'/' + "qmldir"_L1);
            if (qmldirFileInfo.exists()) {
                collectQmlDependency(qmldirFileInfo.absoluteFilePath());
            }

            QString prefer = object.value("prefer"_L1).toString();
            // If the preferred location of Qml files points to the Qt resources, this means
            // that all Qml files has been embedded into plugin and we should not copy them to the
            // android rcc bundle
            if (!prefer.startsWith(":/"_L1)) {
                QVariantList qmlFiles =
                        object.value("components"_L1).toArray().toVariantList();
                qmlFiles.append(object.value("scripts"_L1).toArray().toVariantList());
                bool qmlFilesMissing = false;
                for (const auto &qmlFileEntry : qmlFiles) {
                    QFileInfo fileInfo(qmlFileEntry.toString());
                    if (!fileInfo.exists()) {
                        qmlFilesMissing = true;
                        break;
                    }
                    collectQmlDependency(fileInfo.absoluteFilePath());
                }

                if (qmlFilesMissing) {
                    if (options->verbose)
                        fprintf(stdout,
                                "    -- Skipping because the required qml files are missing.\n");
                    continue;
                }
            }

            options->qtDependencies[options->currentArchitecture].append(qmlImportsDependencies);
        } else {
            // We don't need to handle file and directory imports. Generally those should be
            // considered as part of the application and are therefore scanned separately.
        }
    }

    return true;
}